

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PragmaDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,Token *args_1,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_2)

{
  Token name;
  Token directive;
  PragmaDirectiveSyntax *this_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *in_stack_ffffffffffffffa8;
  PragmaDirectiveSyntax *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  Info *pIVar1;
  undefined8 uVar2;
  Info *pIVar3;
  
  this_00 = (PragmaDirectiveSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pIVar3 = (Info *)*in_RSI;
  pIVar1 = (Info *)*in_RDX;
  uVar2 = in_RDX[1];
  slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)this_00,*in_RCX);
  directive.info = pIVar3;
  directive.kind = (short)uVar2;
  directive._2_1_ = (char)((ulong)uVar2 >> 0x10);
  directive.numFlags.raw = (char)((ulong)uVar2 >> 0x18);
  directive.rawLen = (int)((ulong)uVar2 >> 0x20);
  name.info = pIVar1;
  name.kind = (short)in_stack_ffffffffffffffb8;
  name._2_1_ = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x10);
  name.numFlags.raw = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x18);
  name.rawLen = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  slang::syntax::PragmaDirectiveSyntax::PragmaDirectiveSyntax
            (in_stack_ffffffffffffffb0,directive,name,in_stack_ffffffffffffffa8);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }